

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_23da7e::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  uint pNbChannels;
  char *pcVar1;
  size_t xst;
  int iVar2;
  half *phVar3;
  ChannelList *pCVar4;
  ulong uVar5;
  long lVar6;
  half *phVar7;
  undefined1 in_R10B;
  long lVar8;
  half *phVar9;
  undefined8 *puVar10;
  int pWidth_local;
  int pHeight_local;
  half *local_158;
  size_t local_150;
  StringVector multiView;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  char *local_f0;
  OutputFile lFile;
  Array2D<half> lPixels;
  Array2D<half> lPixelsLeft;
  FrameBuffer lOutputFrameBuffer;
  Header header;
  
  local_158 = (half *)CONCAT44(local_158._4_4_,pCompression);
  pNbChannels = *(uint *)("\t\tRGBA file to RGBA framebuffer" + (long)(int)pImageType * 4 + 0x1d);
  phVar9 = (half *)(ulong)pNbChannels;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  local_150 = CONCAT44(local_150._4_4_,pHeight);
  lVar8 = (long)pHeight;
  lVar6 = (long)(int)(pNbChannels * pWidth);
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6 * lVar8) {
    uVar5 = lVar6 * lVar8 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  local_f0 = pFilename;
  phVar3 = (half *)operator_new__(uVar5);
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  lPixels._sizeX = lVar8;
  lPixels._sizeY = lVar6;
  lPixels._data = phVar3;
  fillPixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    phVar3 = (half *)operator_new__(uVar5);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
    lPixelsLeft._sizeX = lVar8;
    lPixelsLeft._sizeY = lVar6;
    lPixelsLeft._data = phVar3;
    fillPixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0.0;
    Imf_2_5::Header::Header
              (&header,pWidth,(int)local_150,1.0,(V2f *)local_128,1.0,INCREASING_Y,
               (Compression)local_158);
    lVar6 = 0;
    phVar7 = phVar9;
    local_158 = phVar3;
    do {
      pCVar4 = Imf_2_5::Header::channels(&header);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar6);
      Imf_2_5::Channel::Channel((Channel *)local_128,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar4,pcVar1,(Channel *)local_128);
      pCVar4 = Imf_2_5::Header::channels(&header);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar6);
      Imf_2_5::Channel::Channel((Channel *)local_128,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar4,pcVar1,(Channel *)local_128);
      lVar6 = lVar6 + 8;
      phVar7 = (half *)((long)&phVar7[-1]._h + 1);
    } while (phVar7 != (half *)0x0);
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118[0]._M_allocated_capacity._0_4_ = 0x68676972;
    local_118[0]._M_local_buf[4] = 't';
    local_118[0]._M_local_buf[5] = '\0';
    local_128._8_8_ = (pointer)0x5;
    local_128._0_8_ = local_118;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    phVar3 = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ != local_118) {
      operator_delete((void *)local_128._0_8_,
                      CONCAT26(local_118[0]._M_allocated_capacity._6_2_,
                               CONCAT15(local_118[0]._M_local_buf[5],
                                        CONCAT14(local_118[0]._M_local_buf[4],
                                                 (undefined4)local_118[0]._M_allocated_capacity))) +
                      1);
    }
    local_118[0]._M_allocated_capacity._0_4_ = 0x7466656c;
    local_128._8_8_ = (pointer)0x4;
    local_118[0]._M_local_buf[4] = '\0';
    local_128._0_8_ = local_118;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ != local_118) {
      operator_delete((void *)local_128._0_8_,
                      CONCAT26(local_118[0]._M_allocated_capacity._6_2_,
                               CONCAT15(local_118[0]._M_local_buf[5],
                                        CONCAT14(local_118[0]._M_local_buf[4],
                                                 (undefined4)local_118[0]._M_allocated_capacity))) +
                      1);
    }
    Imf_2_5::
    TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_128,&multiView);
    Imf_2_5::Header::insert(&header,"multiView",(Attribute *)local_128);
    local_128._0_8_ = &PTR__TypedAttribute_0043add0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_128 + 8));
    Imf_2_5::Attribute::~Attribute((Attribute *)local_128);
    iVar2 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile(&lFile,local_f0,&header,iVar2);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    xst = (long)phVar9 * 2;
    local_150 = (long)pWidth_local * xst;
    lVar6 = 0;
    phVar7 = lPixels._data;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar6);
      Imf_2_5::Slice::Slice
                ((Slice *)local_128,HALF,(char *)phVar7,xst,local_150,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,(Slice *)local_128);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar6);
      Imf_2_5::Slice::Slice
                ((Slice *)local_128,HALF,(char *)phVar3,xst,local_150,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,(Slice *)local_128);
      phVar3 = phVar3 + 1;
      lVar6 = lVar6 + 8;
      phVar7 = phVar7 + 1;
      phVar9 = (half *)((long)&phVar9[-1]._h + 1);
    } while (phVar9 != (half *)0x0);
    Imf_2_5::OutputFile::setFrameBuffer(&lFile,&lOutputFrameBuffer);
    Imf_2_5::OutputFile::writePixels(&lFile,pHeight_local);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_2_5::OutputFile::~OutputFile(&lFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&multiView);
    Imf_2_5::Header::~Header(&header);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
  }
  else {
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0.0;
    Imf_2_5::Header::Header
              (&header,pWidth,(int)local_150,1.0,(V2f *)local_128,1.0,INCREASING_Y,
               (Compression)local_158);
    puVar10 = &(anonymous_namespace)::CHANNEL_NAMES;
    local_158 = phVar9;
    do {
      pCVar4 = Imf_2_5::Header::channels(&header);
      pcVar1 = (char *)*puVar10;
      Imf_2_5::Channel::Channel((Channel *)local_128,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar4,pcVar1,(Channel *)local_128);
      puVar10 = puVar10 + 1;
      phVar9 = (half *)((long)&phVar9[-1]._h + 1);
    } while (phVar9 != (half *)0x0);
    iVar2 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile((OutputFile *)&multiView,local_f0,&header,iVar2);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar5 = (ulong)(uint)((int)local_158 * 2);
    puVar10 = &(anonymous_namespace)::CHANNEL_NAMES;
    phVar9 = local_158;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar1 = (char *)*puVar10;
      Imf_2_5::Slice::Slice
                ((Slice *)local_128,HALF,(char *)phVar3,uVar5,(long)pWidth * uVar5,1,1,0.0,
                 (bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,(Slice *)local_128);
      phVar3 = phVar3 + 1;
      puVar10 = puVar10 + 1;
      phVar9 = (half *)((long)&phVar9[-1]._h + 1);
    } while (phVar9 != (half *)0x0);
    Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)&multiView,&lOutputFrameBuffer);
    Imf_2_5::OutputFile::writePixels((OutputFile *)&multiView,(int)local_150);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_2_5::OutputFile::~OutputFile((OutputFile *)&multiView);
    Imf_2_5::Header::~Header(&header);
  }
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  return;
}

Assistant:

void
writeFile (const char pFilename[],
           int pHeight,
           int pWidth,
           EImageType pImageType,
           bool pIsStereo,
           Compression pCompression)
{
    const int lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if(pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight,
                    pWidth,
                    lPixelsLeft,
                    lNbChannels,
                    true);

        writePixels (pFilename,
                     pHeight,
                     pWidth,
                     lPixels,
                     lPixelsLeft,
                     lNbChannels,
                     pCompression);
    }
    else
    {
        writePixels (pFilename,
                    pHeight,
                    pWidth,
                    lPixels,
                    lNbChannels,
                    pCompression);
    }
}